

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ins_ekf.cpp
# Opt level: O3

void __thiscall ins_ekf::InsEkf::Predict(InsEkf *this,double dt)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  long lVar6;
  ulong uVar7;
  undefined8 *puVar8;
  undefined1 *puVar9;
  evaluator<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *peVar10;
  double *pdVar11;
  ActualDstType actualDst_1;
  assign_op<double,_double> *paVar12;
  DstEvaluatorType *pDVar13;
  char *__function;
  ActualDstType actualDst_2;
  long lVar14;
  ActualDstType actualDst;
  Matrix<double,_15,_15,_0,_15,_15> *dst;
  int i;
  undefined8 *puVar15;
  evaluator<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *peVar16;
  double *pdVar17;
  long lVar18;
  ActualDstType actualDst_3;
  Vector3d *pVVar19;
  double dVar20;
  double dVar21;
  XprTypeNested pMVar22;
  undefined1 auVar23 [16];
  double dVar24;
  double dVar26;
  undefined1 auVar25 [16];
  double dVar27;
  double dVar35;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  bool bVar37;
  double dVar38;
  double dVar44;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  double dVar45;
  undefined8 uVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  DstEvaluatorType dstEvaluator_9;
  Vector3d w_est;
  Matrix3d R_pert;
  Matrix3d R_ItoB_hat;
  Matrix4d omega;
  Matrix3d Jr;
  DstEvaluatorType dstEvaluator_8;
  DstEvaluatorType dstEvaluator_7;
  Matrix3d w_ss;
  Matrix3d d_w_skew_d_biasGq;
  Matrix3d d_w_skew_d_biasGr;
  Matrix<double,_15,_15,_0,_15,_15> GQG;
  Matrix3d d_w_skew_d_biasGp;
  Matrix<double,_15,_12,_0,_15,_12> Gk;
  Matrix<double,_12,_12,_0,_12,_12> Qd;
  Matrix<double,_15,_15,_0,_15,_15> Phi_k;
  assign_op<double,_double> local_1bc9;
  double local_1bc8;
  double dStack_1bc0;
  Matrix<double,_3,_1,_0,_3,_1> *local_1bb0;
  double local_1ba8;
  Vector3d *local_1b98;
  double local_1b90;
  undefined1 local_1b88 [16];
  assign_op<double,_double> *local_1b78;
  undefined8 uStack_1b70;
  plainobjectbase_evaluator_data<double,_15> local_1b60;
  Vector3d local_1b58;
  undefined1 local_1b38 [80];
  undefined1 local_1ae8 [16];
  plainobjectbase_evaluator_data<double,_0> local_1ad8;
  double dStack_1ad0;
  scalar_constant_op<double> sStack_1ac8;
  double local_1ac0;
  scalar_constant_op<double> local_1ab8;
  double dStack_1ab0;
  scalar_constant_op<double> local_1aa8;
  double dStack_1aa0;
  Matrix<double,_3,_1,_0,_3,_1> local_1a98;
  double dStack_1a80;
  double local_1a78;
  double dStack_1a70;
  double local_1a68;
  double dStack_1a60;
  double local_1a58;
  double dStack_1a50;
  double local_1a48;
  double dStack_1a40;
  double local_1a38 [4];
  undefined1 local_1a18 [72];
  undefined1 local_19d0 [32];
  undefined1 local_19b0 [40];
  Matrix<double,_15,_15,_0,_15,_15> *local_1988;
  Matrix3d local_1980;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
  local_1938;
  Matrix<double,_3,_3,_0,_3,_3> local_18f0;
  undefined1 local_18a8 [24];
  RhsNested RStack_1890;
  scalar_constant_op<double> local_1888;
  RhsNested local_1880;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
  *local_1878;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
  *pCStack_1870;
  scalar_constant_op<double> local_1868;
  scalar_constant_op<double> local_1858;
  scalar_constant_op<double> local_1850;
  undefined1 local_11a0 [72];
  undefined1 local_1158 [32];
  scalar_constant_op<double> local_1138;
  variable_if_dynamic<long,__1> local_1130;
  scalar_constant_op<double> local_1128;
  scalar_constant_op<double> local_1118;
  undefined1 local_fd8 [24];
  assign_op<double,_double> local_fc0 [392];
  undefined1 local_e38 [384];
  undefined1 local_cb8 [256];
  undefined1 local_bb8 [40];
  undefined8 uStack_b90;
  double local_b88;
  undefined1 local_a78 [312];
  undefined1 local_940 [312];
  undefined1 local_808 [192];
  double adStack_748 [2];
  undefined1 local_738 [80];
  double dStack_6e8;
  Vector3d *local_6e0;
  double dStack_6d8;
  Matrix<double,_3,_1,_0,_3,_1> *pMStack_6d0;
  double local_6c8;
  Vector3d *pVStack_6c0;
  Vector3d *local_6b8;
  double dStack_6b0;
  double dStack_6a0;
  Matrix3d **local_698;
  Matrix3d *local_690;
  double dStack_688;
  double local_678;
  double local_668;
  undefined1 local_5b0 [360];
  undefined1 local_448 [24];
  undefined1 local_430 [304];
  undefined1 local_300 [80];
  undefined1 local_2b0 [64];
  undefined1 local_270 [24];
  undefined1 local_258 [296];
  undefined1 local_130 [256];
  long lVar36;
  
  local_1b58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (this->last_measurements_).super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.
         m_storage.m_data.array[0] -
         (this->bias_g_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[0];
  local_1b58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = (this->last_measurements_).super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.
         m_storage.m_data.array[1] -
         (this->bias_g_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[1];
  local_1b58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = (this->last_measurements_).super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.
         m_storage.m_data.array[2] -
         (this->bias_g_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[2];
  local_1bc8 = (this->last_measurements_).
               super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.m_storage.m_data.array
               [3] - (this->bias_a_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[0];
  dStack_1bc0 = (this->last_measurements_).
                super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.m_storage.m_data.
                array[4] -
                (this->bias_a_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                m_storage.m_data.array[1];
  local_1b78 = (assign_op<double,_double> *)
               ((this->last_measurements_).
                super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.m_storage.m_data.
                array[5] -
               (this->bias_a_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
               m_storage.m_data.array[2]);
  uStack_1b70 = 0;
  SkewSymmetric((Matrix3d *)local_18a8,&local_1b58);
  SkewSymmetric((Matrix3d *)local_1158,&local_1b58);
  lVar6 = 0x10;
  do {
    dVar21 = *(double *)(local_1158 + lVar6);
    dVar20 = *(double *)(local_11a0 + lVar6 + 0x38);
    dVar24 = *(double *)(local_11a0 + lVar6 + 0x40);
    *(double *)((long)adStack_748 + lVar6) =
         dVar24 * (double)RStack_1890.m_matrix + dVar20 * (double)local_18a8._0_8_ +
         dVar21 * (double)local_1878;
    *(double *)((long)adStack_748 + lVar6 + 8) =
         dVar24 * local_1888.m_other + dVar20 * (double)local_18a8._8_8_ +
         dVar21 * (double)pCStack_1870;
    *(double *)(local_738 + lVar6) =
         (double)local_1880.m_matrix * dVar24 + dVar21 * local_1868.m_other +
         (double)local_18a8._16_8_ * dVar20;
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x58);
  local_1b98 = &this->imu_offset_;
  dVar21 = (this->imu_offset_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array[0];
  dVar20 = (this->imu_offset_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array[1];
  dVar24 = (this->imu_offset_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array[2];
  local_1bc8 = local_1bc8 -
               ((double)local_738._48_8_ * dVar24 +
               dVar20 * (double)local_738._24_8_ + dVar21 * (double)local_738._0_8_);
  dStack_1bc0 = dStack_1bc0 -
                ((double)local_738._56_8_ * dVar24 +
                dVar20 * (double)local_738._32_8_ + dVar21 * (double)local_738._8_8_);
  local_1b78 = (assign_op<double,_double> *)
               ((double)local_1b78 -
               (dVar24 * (double)local_738._64_8_ + dVar20 * (double)local_738._40_8_ +
               dVar21 * (double)local_738._16_8_));
  SkewSymmetric(&local_1980,&local_1b58);
  local_1a38[2] = 0.0;
  local_1a38[3] = 0.0;
  local_1a38[0] = 0.0;
  local_1a38[1] = 0.0;
  local_1a48 = 0.0;
  dStack_1a40 = 0.0;
  local_1a58 = 0.0;
  dStack_1a50 = 0.0;
  local_1a68 = 0.0;
  dStack_1a60 = 0.0;
  local_1a78 = 0.0;
  dStack_1a70 = 0.0;
  local_1a98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = 0.0;
  dStack_1a80 = 0.0;
  local_1a98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = 0.0;
  local_1a98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  lVar6 = 0x10;
  pdVar11 = local_1980.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
            .array + 2;
  do {
    dVar21 = pdVar11[-1];
    *(double *)((long)&local_1aa8.m_other + lVar6) =
         -((plain_array<double,_9,_0,_0> *)(pdVar11 + -2))->array[0];
    *(double *)((long)&dStack_1aa0 + lVar6) = -dVar21;
    *(double *)
     ((long)local_1a98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
            .array + lVar6) = -*pdVar11;
    pdVar11 = pdVar11 + 3;
    lVar6 = lVar6 + 0x20;
  } while (lVar6 != 0x70);
  local_738._0_8_ = &dStack_1a80;
  local_1a38[0] =
       local_1b58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
       array[0];
  local_1a38[1] =
       local_1b58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
       array[1];
  local_1a38[2] =
       local_1b58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
       array[2];
  local_738._8_8_ = (non_const_type)0x1;
  local_738._16_8_ = (Matrix<double,_3,_1,_0,_3,_1> *)0x3;
  local_738._24_8_ = &local_1a98;
  local_738._32_8_ = 1.48219693752374e-323;
  local_738._40_8_ = 0.0;
  local_738._48_8_ = (Matrix<double,_3,_1,_0,_3,_1> *)0x4;
  local_18a8._0_8_ = (assign_op<double,_double> *)&local_1b58;
  Eigen::internal::
  check_for_aliasing<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>const>>
            ((Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)local_738,
             (CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)local_18a8);
  if (((non_const_type)local_738._8_8_ == (non_const_type)0x1) &&
     ((Matrix<double,_3,_1,_0,_3,_1> *)local_738._16_8_ == (Matrix<double,_3,_1,_0,_3,_1> *)0x3)) {
    lVar6 = 0;
    do {
      *(ulong *)(local_738._0_8_ + lVar6 * 4) =
           *(ulong *)(local_18a8._0_8_ + lVar6) ^ 0x8000000000000000;
      lVar6 = lVar6 + 8;
    } while (lVar6 != 0x18);
    auVar39._0_8_ =
         local_1b58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[1] *
         local_1b58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[1] +
         local_1b58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[0] *
         local_1b58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[0];
    auVar39._8_8_ =
         local_1b58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[1] *
         local_1b58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[1];
    auVar23._0_8_ =
         local_1b58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[2] *
         local_1b58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[2] + auVar39._0_8_;
    auVar23._8_8_ = 0;
    local_1b88 = sqrtpd(auVar39,auVar23);
    if (local_1b88._0_8_ <= 1e-10) {
      dVar20 = dt * 0.5;
      dVar27 = local_1a98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[0] * dVar20 + 1.0;
      dVar35 = local_1a98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[1] * dVar20 + 0.0;
      dVar24 = local_1a98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[2] * dVar20 + 0.0;
      dVar26 = dStack_1a80 * dVar20 + 0.0;
      dVar54 = 0.0;
      dVar21 = 1.0;
      dVar38 = local_1a78 * dVar20 + 0.0;
      dVar44 = dStack_1a70 * dVar20 + 1.0;
      dVar45 = local_1a68 * dVar20 + 0.0;
      dVar47 = dStack_1a60 * dVar20 + 0.0;
      dVar48 = local_1a58 * dVar20 + 0.0;
      dVar49 = dStack_1a50 * dVar20 + 0.0;
      dVar50 = local_1a48 * dVar20 + 1.0;
      dVar51 = dStack_1a40 * dVar20 + 0.0;
      dVar52 = local_1a38[0] * dVar20 + 0.0;
      dVar53 = local_1a38[1] * dVar20 + 0.0;
    }
    else {
      local_1bb0 = (Matrix<double,_3,_1,_0,_3,_1> *)(local_1b88._0_8_ * 0.5 * dt);
      local_1ba8 = cos((double)local_1bb0);
      local_1b90 = 1.0 / (double)local_1b88._0_8_;
      dVar20 = sin((double)local_1bb0);
      dVar20 = dVar20 * local_1b90;
      dVar54 = local_1ba8 * 0.0;
      dVar27 = local_1a98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[0] * dVar20 + local_1ba8;
      dVar35 = local_1a98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[1] * dVar20 + dVar54;
      dVar24 = local_1a98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[2] * dVar20 + dVar54;
      dVar26 = dStack_1a80 * dVar20 + dVar54;
      dVar38 = local_1a78 * dVar20 + dVar54;
      dVar44 = dStack_1a70 * dVar20 + local_1ba8;
      dVar45 = local_1a68 * dVar20 + dVar54;
      dVar47 = dStack_1a60 * dVar20 + dVar54;
      dVar48 = local_1a58 * dVar20 + dVar54;
      dVar49 = dStack_1a50 * dVar20 + dVar54;
      dVar50 = local_1a48 * dVar20 + local_1ba8;
      dVar51 = dStack_1a40 * dVar20 + dVar54;
      dVar52 = local_1a38[0] * dVar20 + dVar54;
      dVar53 = local_1a38[1] * dVar20 + dVar54;
      dVar21 = local_1ba8;
    }
    dVar1 = (this->orientation_).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
            m_storage.m_data.array[0];
    dVar2 = (this->orientation_).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
            m_storage.m_data.array[1];
    dVar3 = (this->orientation_).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
            m_storage.m_data.array[2];
    dVar4 = (this->orientation_).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
            m_storage.m_data.array[3];
    (this->orientation_).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
    m_data.array[0] = dVar52 * dVar4 + dVar48 * dVar3 + dVar38 * dVar2 + dVar27 * dVar1;
    (this->orientation_).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
    m_data.array[1] = dVar53 * dVar4 + dVar49 * dVar3 + dVar44 * dVar2 + dVar35 * dVar1;
    (this->orientation_).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
    m_data.array[2] =
         dVar4 * (dVar20 * local_1a38[2] + dVar54) +
         dVar3 * dVar50 + dVar2 * dVar45 + dVar1 * dVar24;
    (this->orientation_).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
    m_data.array[3] =
         dVar4 * (dVar20 * local_1a38[3] + dVar21) +
         dVar3 * dVar51 + dVar2 * dVar47 + dVar1 * dVar26;
    pVVar19 = (Vector3d *)local_738;
    QuatToRPY(pVVar19,&this->orientation_);
    RPYToRotMat((Matrix3d *)local_1ae8,pVVar19);
    local_738._16_8_ = &this->velocity_;
    local_738._48_8_ = &this->gravity_;
    local_738._64_8_ = local_738 + 0x48;
    local_738._72_8_ =
         (double)local_1ad8.data * (double)local_1b78 +
         (double)local_1ae8._8_8_ * dStack_1bc0 + (double)local_1ae8._0_8_ * local_1bc8;
    dStack_6e8 = local_1ac0 * (double)local_1b78 +
                 dStack_1bc0 * sStack_1ac8.m_other + local_1bc8 * dStack_1ad0;
    dVar24 = (this->gravity_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
             .m_data.array[0];
    dVar26 = (this->gravity_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
             .m_data.array[1];
    dVar35 = dt * (double)local_738._72_8_ +
             ((this->velocity_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[0] - dt * dVar24);
    dVar38 = dt * dStack_6e8 +
             ((this->velocity_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[1] - dt * dVar26);
    (this->velocity_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[0] = dVar35;
    (this->velocity_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[1] = dVar38;
    dVar21 = (this->gravity_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
             .m_data.array[2];
    dVar27 = ((double)local_1b78 * local_1aa8.m_other +
             dStack_1bc0 * dStack_1ab0 + local_1bc8 * local_1ab8.m_other) * dt +
             ((this->velocity_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[2] - dt * dVar21);
    local_690 = (Matrix3d *)
                ((double)local_1ad8.data * 0.5 * (double)local_1b78 +
                (double)local_1ae8._8_8_ * 0.5 * dStack_1bc0 +
                (double)local_1ae8._0_8_ * 0.5 * local_1bc8);
    dStack_688 = local_1ac0 * 0.5 * (double)local_1b78 +
                 sStack_1ac8.m_other * 0.5 * dStack_1bc0 + dStack_1ad0 * 0.5 * local_1bc8;
    (this->velocity_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[2] = dVar27;
    local_738._24_8_ = &this->position_;
    local_6e0 = (Vector3d *)0x3fe0000000000000;
    local_698 = &local_690;
    dVar20 = (this->position_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
             m_storage.m_data.array[1];
    (this->position_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[0] = dt * dt * (double)local_690 +
               ((dt * dVar35 +
                (this->position_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                m_storage.m_data.array[0]) - dt * dt * dVar24 * 0.5);
    (this->position_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[1] = dt * dt * dStack_688 + ((dt * dVar38 + dVar20) - dt * dt * dVar26 * 0.5);
    (this->position_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[2] = (local_1aa8.m_other * 0.5 * (double)local_1b78 +
               dStack_1ab0 * 0.5 * dStack_1bc0 + local_1ab8.m_other * 0.5 * local_1bc8) * dt * dt +
               ((dVar27 * dt +
                (this->position_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                m_storage.m_data.array[2]) - dVar21 * 0.5 * dt * dt);
    local_1b38._0_8_ = 1.0;
    local_1b38._8_8_ = 0.0;
    local_1b38._16_8_ = 0.0;
    local_1b38._24_8_ = 0.0;
    local_1b38._32_8_ = 1.0;
    local_1b38._40_8_ = 0.0;
    local_1b38._48_8_ = 0.0;
    local_1a18._0_8_ = 1.0;
    local_1a18._8_8_ = 0.0;
    local_1a18._16_8_ = 0.0;
    local_1a18._24_8_ = 0.0;
    local_1a18._32_8_ = 1.0;
    local_1a18._40_8_ = 0.0;
    local_1a18._48_8_ = 0.0;
    dVar21 = (double)local_1b88._0_8_ * dt;
    local_1b38._56_8_ = 0.0;
    local_1b38._64_8_ = 1.0;
    local_1a18._56_8_ = 0.0;
    local_1a18._64_8_ = 1.0;
    local_738._32_8_ = dt;
    local_738._40_8_ = dt;
    local_738._56_8_ = local_738._16_8_;
    dStack_6d8 = dt;
    pMStack_6d0 = (Matrix<double,_3,_1,_0,_3,_1> *)local_738._48_8_;
    local_6c8 = dt;
    local_6b8 = (Vector3d *)dt;
    local_678 = dt;
    local_668 = dt;
    if (1e-10 < dVar21) {
      auVar5._8_8_ = local_1b58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[1];
      auVar5._0_8_ = local_1b58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[0];
      auVar25._8_8_ = local_1b88._0_8_;
      auVar25._0_8_ = local_1b88._0_8_;
      local_bb8._0_16_ = divpd(auVar5,auVar25);
      local_bb8._16_8_ =
           local_1b58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2] / (double)local_1b88._0_8_;
      local_1ba8 = dVar21;
      pMVar22 = (XprTypeNested)cos(dVar21);
      local_1b88._0_8_ = pMVar22;
      local_1b90 = cos(local_1ba8);
      local_1b90 = 1.0 - local_1b90;
      local_1bb0 = (Matrix<double,_3,_1,_0,_3,_1> *)sin(local_1ba8);
      SkewSymmetric((Matrix3d *)local_18a8,(Vector3d *)local_bb8);
      local_738._24_8_ = local_1b88._0_8_;
      local_738._64_8_ = local_1b90;
      pMStack_6d0 = (Matrix<double,_3,_1,_0,_3,_1> *)local_1b90;
      dStack_6b0 = 4.94065645841247e-324;
      dStack_6a0 = (double)local_1bb0;
      local_11a0._0_8_ = local_1b38;
      local_1158._16_8_ = &local_1938;
      local_1b38._0_8_ =
           (double)local_1bb0 * (double)local_18a8._0_8_ +
           local_1b90 * (double)local_bb8._0_8_ * (double)local_bb8._0_8_ + (double)local_1b88._0_8_
      ;
      local_1158._0_8_ = (XprTypeNested)local_11a0;
      local_1158._8_8_ = (SrcEvaluatorType *)local_738;
      local_1158._24_8_ = local_11a0._0_8_;
      local_738._72_8_ = (Vector3d *)local_bb8;
      local_6e0 = (Vector3d *)local_bb8;
      pVStack_6c0 = (Vector3d *)local_bb8;
      local_6b8 = (Vector3d *)local_bb8;
      local_690 = (Matrix3d *)local_18a8;
      Eigen::internal::
      copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_1,_9>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
             *)local_1158);
      dVar21 = sin(local_1ba8);
      local_1b88._0_8_ = dVar21 / local_1ba8;
      dVar21 = sin(local_1ba8);
      local_1bb0 = (Matrix<double,_3,_1,_0,_3,_1> *)(1.0 - dVar21 / local_1ba8);
      dVar21 = cos(local_1ba8);
      local_1ba8 = (1.0 - dVar21) / local_1ba8;
      SkewSymmetric((Matrix3d *)local_18a8,(Vector3d *)local_bb8);
      local_738._24_8_ = local_1b88._0_8_;
      local_738._64_8_ = local_1bb0;
      pMStack_6d0 = local_1bb0;
      dStack_6b0 = 4.94065645841247e-324;
      dStack_6a0 = local_1ba8;
      local_690 = (Matrix3d *)local_18a8;
      local_11a0._0_8_ = local_1a18;
      local_1158._16_8_ = &local_1938;
      local_1a18._0_8_ =
           ((double)local_1bb0 * (double)local_bb8._0_8_ * (double)local_bb8._0_8_ +
           (double)local_1b88._0_8_) - local_1ba8 * (double)local_18a8._0_8_;
      local_1158._0_8_ = (XprTypeNested)local_11a0;
      local_1158._8_8_ = (SrcEvaluatorType *)local_738;
      local_1158._24_8_ = local_11a0._0_8_;
      local_738._72_8_ = (Vector3d *)local_bb8;
      local_6e0 = (Vector3d *)local_bb8;
      pVStack_6c0 = (Vector3d *)local_bb8;
      local_6b8 = (Vector3d *)local_bb8;
      Eigen::internal::
      copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_1,_9>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
             *)local_1158);
    }
    lVar6 = 0;
    memset(pVVar19,0,0x708);
    uVar7 = (ulong)((uint)((ulong)pVVar19 >> 3) & 1);
    do {
      if (uVar7 == 0) {
        dVar21 = *(double *)(local_1b38 + lVar6 + 8);
        (pVVar19->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
        array[0] = *(double *)(local_1b38 + lVar6);
        (pVVar19->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
        array[1] = dVar21;
        (pVVar19->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
        array[2] = *(double *)(local_1b38 + lVar6 + 0x10);
      }
      else {
        pdVar17 = (double *)(local_1b38 + lVar6);
        (pVVar19->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
        array[0] = *pdVar17;
        dVar21 = (pdVar17 + uVar7)[1];
        pdVar11 = (pVVar19->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                  m_data.array + uVar7;
        *pdVar11 = pdVar17[uVar7];
        pdVar11[1] = dVar21;
      }
      uVar7 = uVar7 ^ 1;
      lVar6 = lVar6 + 0x18;
      pVVar19 = pVVar19 + 5;
    } while (lVar6 != 0x48);
    local_1bc8 = local_1bc8 * dt;
    dStack_1bc0 = dStack_1bc0 * dt;
    local_bb8._8_8_ = dt * dStack_1bc0;
    local_bb8._0_8_ = dt * local_1bc8;
    local_1b78 = (assign_op<double,_double> *)((double)local_1b78 * dt);
    local_bb8._16_8_ = (double)local_1b78 * dt;
    SkewSymmetric((Matrix3d *)local_1158,(Vector3d *)local_bb8);
    lVar6 = 0x10;
    do {
      dVar20 = *(double *)(local_11a0 + lVar6 + 0x38);
      dVar24 = *(double *)(local_11a0 + lVar6 + 0x40);
      dVar21 = *(double *)(local_1158 + lVar6);
      *(double *)
       ((long)local_18f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array + lVar6 + 0x38) =
           ((double)local_1ae8._8_8_ * -0.5 * dVar24 + (double)local_1ae8._0_8_ * -0.5 * dVar20) -
           dVar21 * (double)local_1ad8.data * 0.5;
      *(double *)
       ((long)local_18f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array + lVar6 + 0x40) =
           (sStack_1ac8.m_other * -0.5 * dVar24 + dStack_1ad0 * -0.5 * dVar20) -
           dVar21 * local_1ac0 * 0.5;
      *(double *)(local_18a8 + lVar6) =
           (dVar24 * dStack_1ab0 * -0.5 + dVar20 * local_1ab8.m_other * -0.5) -
           local_1aa8.m_other * 0.5 * dVar21;
      lVar6 = lVar6 + 0x18;
    } while (lVar6 != 0x58);
    puVar8 = (undefined8 *)(local_738 + 0x18);
    uVar7 = 0;
    lVar6 = 0;
    do {
      if (uVar7 == 0) {
        uVar46 = *(undefined8 *)(local_18a8 + lVar6 + 8);
        *puVar8 = *(undefined8 *)(local_18a8 + lVar6);
        puVar8[1] = uVar46;
        puVar8[2] = *(undefined8 *)(local_18a8 + lVar6 + 0x10);
      }
      else {
        puVar15 = (undefined8 *)(local_18a8 + lVar6);
        *puVar8 = *puVar15;
        uVar46 = (puVar15 + uVar7)[1];
        puVar8[uVar7] = puVar15[uVar7];
        (puVar8 + uVar7)[1] = uVar46;
      }
      uVar7 = uVar7 ^ 1;
      lVar6 = lVar6 + 0x18;
      puVar8 = puVar8 + 0xf;
    } while (lVar6 != 0x48);
    local_bb8._8_8_ = dStack_1bc0;
    local_bb8._0_8_ = local_1bc8;
    local_bb8._16_8_ = local_1b78;
    SkewSymmetric((Matrix3d *)local_1158,(Vector3d *)local_bb8);
    lVar6 = 0x10;
    do {
      dVar20 = *(double *)(local_11a0 + lVar6 + 0x38);
      dVar24 = *(double *)(local_11a0 + lVar6 + 0x40);
      dVar21 = *(double *)(local_1158 + lVar6);
      *(double *)
       ((long)local_18f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array + lVar6 + 0x38) =
           (dVar24 * -(double)local_1ae8._8_8_ + dVar20 * -(double)local_1ae8._0_8_) -
           dVar21 * (double)local_1ad8.data;
      *(double *)
       ((long)local_18f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array + lVar6 + 0x40) =
           (dVar24 * -sStack_1ac8.m_other + dVar20 * -dStack_1ad0) - dVar21 * local_1ac0;
      *(double *)(local_18a8 + lVar6) =
           (dVar24 * -dStack_1ab0 + dVar20 * -local_1ab8.m_other) - local_1aa8.m_other * dVar21;
      lVar6 = lVar6 + 0x18;
    } while (lVar6 != 0x58);
    puVar8 = (undefined8 *)(local_738 + 0x30);
    uVar7 = (ulong)((uint)((ulong)puVar8 >> 3) & 1);
    lVar6 = 0;
    do {
      if (uVar7 == 0) {
        uVar46 = *(undefined8 *)(local_18a8 + lVar6 + 8);
        *puVar8 = *(undefined8 *)(local_18a8 + lVar6);
        puVar8[1] = uVar46;
        puVar8[2] = *(undefined8 *)(local_18a8 + lVar6 + 0x10);
      }
      else {
        puVar15 = (undefined8 *)(local_18a8 + lVar6);
        *puVar8 = *puVar15;
        uVar46 = (puVar15 + uVar7)[1];
        puVar8[uVar7] = puVar15[uVar7];
        (puVar8 + uVar7)[1] = uVar46;
      }
      uVar7 = uVar7 ^ 1;
      lVar6 = lVar6 + 0x18;
      puVar8 = puVar8 + 0xf;
    } while (lVar6 != 0x48);
    puVar9 = local_5b0;
    lVar6 = 0;
    lVar14 = 0;
    do {
      lVar18 = 0;
      auVar28 = _DAT_001104c0;
      do {
        bVar37 = SUB164(auVar28 ^ _DAT_001104d0,4) == -0x80000000 &&
                 SUB164(auVar28 ^ _DAT_001104d0,0) < -0x7ffffffd;
        if (bVar37) {
          uVar46 = 0x3ff0000000000000;
          if (lVar6 != lVar18) {
            uVar46 = 0;
          }
          *(undefined8 *)(puVar9 + lVar18 + -8) = uVar46;
        }
        if (bVar37) {
          uVar46 = 0x3ff0000000000000;
          if (lVar6 + -8 != lVar18) {
            uVar46 = 0;
          }
          *(undefined8 *)(puVar9 + lVar18) = uVar46;
        }
        lVar36 = auVar28._8_8_;
        auVar28._0_8_ = auVar28._0_8_ + 2;
        auVar28._8_8_ = lVar36 + 2;
        lVar18 = lVar18 + 0x10;
      } while (lVar18 != 0x20);
      lVar14 = lVar14 + 1;
      lVar6 = lVar6 + 8;
      puVar9 = puVar9 + 0x78;
    } while (lVar14 != 3);
    puVar9 = local_448;
    lVar6 = 0;
    lVar14 = 0;
    do {
      lVar18 = 0;
      auVar29 = _DAT_001104c0;
      do {
        bVar37 = SUB164(auVar29 ^ _DAT_001104d0,4) == -0x80000000 &&
                 SUB164(auVar29 ^ _DAT_001104d0,0) < -0x7ffffffd;
        if (bVar37) {
          dVar21 = 1.0;
          if (lVar6 != lVar18) {
            dVar21 = 0.0;
          }
          *(double *)(puVar9 + lVar18 + -8) = dVar21 * dt;
        }
        if (bVar37) {
          dVar21 = 1.0;
          if (lVar6 + -8 != lVar18) {
            dVar21 = 0.0;
          }
          *(double *)(puVar9 + lVar18) = dVar21 * dt;
        }
        lVar36 = auVar29._8_8_;
        auVar29._0_8_ = auVar29._0_8_ + 2;
        auVar29._8_8_ = lVar36 + 2;
        lVar18 = lVar18 + 0x10;
      } while (lVar18 != 0x20);
      lVar14 = lVar14 + 1;
      lVar6 = lVar6 + 8;
      puVar9 = puVar9 + 0x78;
    } while (lVar14 != 3);
    puVar9 = local_430;
    lVar6 = 0;
    lVar14 = 0;
    do {
      lVar18 = 0;
      auVar30 = _DAT_001104c0;
      do {
        bVar37 = SUB164(auVar30 ^ _DAT_001104d0,4) == -0x80000000 &&
                 SUB164(auVar30 ^ _DAT_001104d0,0) < -0x7ffffffd;
        if (bVar37) {
          uVar46 = 0x3ff0000000000000;
          if (lVar6 != lVar18) {
            uVar46 = 0;
          }
          *(undefined8 *)(puVar9 + lVar18 + -8) = uVar46;
        }
        if (bVar37) {
          uVar46 = 0x3ff0000000000000;
          if (lVar6 + -8 != lVar18) {
            uVar46 = 0;
          }
          *(undefined8 *)(puVar9 + lVar18) = uVar46;
        }
        lVar36 = auVar30._8_8_;
        auVar30._0_8_ = auVar30._0_8_ + 2;
        auVar30._8_8_ = lVar36 + 2;
        lVar18 = lVar18 + 0x10;
      } while (lVar18 != 0x20);
      lVar14 = lVar14 + 1;
      lVar6 = lVar6 + 8;
      puVar9 = puVar9 + 0x78;
    } while (lVar14 != 3);
    local_1bc8 = -1.06099789548264e-314;
    dStack_1bc0 = -1.06099789548264e-314;
    local_1158._0_8_ = (XprTypeNested)local_300;
    local_1158._8_8_ = (SrcEvaluatorType *)0x3;
    local_1158._16_8_ = (assign_op<double,_double> *)0x3;
    local_1158._24_8_ = (XprTypeNested)local_738;
    local_1138.m_other = 0.0;
    local_1130.m_value = 9;
    local_1128.m_other = 7.4109846876187e-323;
    local_18a8._8_8_ = (SrcEvaluatorType *)(local_18a8 + 0x10);
    lVar6 = 0x20;
    do {
      dVar21 = *(double *)((long)local_1a38 + lVar6 + 0x10);
      dVar20 = *(double *)((long)local_1a38 + lVar6);
      dVar24 = *(double *)((long)local_1a38 + lVar6 + 8);
      *(double *)
       ((long)local_18f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array + lVar6 + 0x38) =
           dVar24 * -(double)local_1b38._24_8_ + dVar20 * -(double)local_1b38._0_8_ +
           dVar21 * -(double)local_1b38._48_8_;
      *(double *)
       ((long)local_18f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array + lVar6 + 0x40) =
           dVar24 * -(double)local_1b38._32_8_ + dVar20 * -(double)local_1b38._8_8_ +
           dVar21 * -(double)local_1b38._56_8_;
      *(double *)(local_18a8 + lVar6) =
           (dVar21 * -(double)local_1b38._64_8_ - dVar24 * (double)local_1b38._40_8_) -
           dVar20 * (double)local_1b38._16_8_;
      lVar6 = lVar6 + 0x18;
    } while (lVar6 != 0x68);
    local_bb8._16_8_ = &local_1938;
    local_1850.m_other = dt;
    local_11a0._0_8_ = (XprTypeNested)local_300;
    local_bb8._24_8_ = (XprTypeNested)local_1158;
    local_bb8._0_8_ =
         (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
          *)local_11a0;
    local_bb8._8_8_ = (SrcEvaluatorType *)local_18a8;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *)local_bb8);
    local_18a8._0_8_ = (assign_op<double,_double> *)0xbff0000000000000;
    local_18a8._8_8_ = (SrcEvaluatorType *)0x0;
    local_18a8._16_8_ = 0.0;
    SkewSymmetric((Matrix3d *)local_11a0,(Vector3d *)local_18a8);
    local_bb8._8_8_ = 3;
    local_bb8._0_8_ = local_300 + 0x18;
    local_bb8._16_8_ = (assign_op<double,_double> *)0x1;
    local_bb8._24_8_ = local_738;
    uStack_b90 = 9;
    local_bb8._32_8_ = 3;
    local_b88 = 7.4109846876187e-323;
    local_1158._16_8_ = local_1158 + 0x18;
    local_18a8._16_8_ = (DstEvaluatorType *)0xbfe0000000000000;
    RStack_1890.m_matrix = (non_const_type)local_1ae8;
    local_1880.m_matrix = &local_1980;
    local_1858.m_other = (double)local_1b98;
    local_1878 = (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                  *)local_11a0;
    pCStack_1870 = (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                    *)local_11a0;
    local_1868.m_other = (double)local_1880.m_matrix;
    Eigen::internal::
    call_dense_assignment_loop<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const>,0>,Eigen::Matrix<double,3,1,0,3,1>,1>,Eigen::internal::assign_op<double,double>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)local_1158._16_8_,
               (Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>
                *)local_18a8,(assign_op<double,_double> *)&local_1938);
    local_1128.m_other = dt;
    local_1118.m_other = dt;
    if (((SrcEvaluatorType *)local_bb8._8_8_ == (SrcEvaluatorType *)0x3) &&
       ((assign_op<double,_double> *)local_bb8._16_8_ == (assign_op<double,_double> *)0x1)) {
      local_1938._0_8_ = local_bb8._0_8_;
      local_18a8._8_8_ = local_1158;
      local_18a8._16_8_ = &local_18f0;
      local_18a8._0_8_ = &local_1938;
      RStack_1890.m_matrix = (non_const_type)local_bb8;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
             *)local_18a8);
      pVVar19 = local_1b98;
      local_18a8._8_8_ = local_1ae8;
      RStack_1890.m_matrix = &local_1980;
      local_1868.m_other = (double)local_1b98;
      local_1158._0_8_ = local_300 + 0x30;
      local_1158._8_8_ = (SrcEvaluatorType *)0x3;
      local_1158._16_8_ = (assign_op<double,_double> *)0x1;
      local_1158._24_8_ = local_738;
      local_1138.m_other = 2.96439387504748e-323;
      local_1130.m_value = 9;
      local_1128.m_other = 7.4109846876187e-323;
      local_1888.m_other = (double)local_11a0;
      local_1880.m_matrix = (non_const_type)local_11a0;
      local_1878 = (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                    *)RStack_1890.m_matrix;
      local_1858.m_other = dt;
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Block<Eigen::Matrix<double,15,15,0,15,15>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>,Eigen::internal::assign_op<double,double>>
                ((Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false> *)local_1158,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)local_18a8,(assign_op<double,_double> *)local_bb8);
      local_18a8._0_8_ = (assign_op<double,_double> *)0x0;
      local_18a8._8_8_ = (SrcEvaluatorType *)0xbff0000000000000;
      local_18a8._16_8_ = 0.0;
      SkewSymmetric((Matrix3d *)&local_1938,(Vector3d *)local_18a8);
      local_bb8._8_8_ = 3;
      local_bb8._0_8_ = local_270;
      local_bb8._16_8_ = (assign_op<double,_double> *)0x1;
      local_bb8._24_8_ = local_738;
      uStack_b90 = 10;
      local_bb8._32_8_ = 3;
      local_b88 = 7.4109846876187e-323;
      local_1158._16_8_ = local_1158 + 0x18;
      local_18a8._16_8_ = (DstEvaluatorType *)0xbfe0000000000000;
      RStack_1890.m_matrix = (non_const_type)local_1ae8;
      local_1880.m_matrix = &local_1980;
      local_1858.m_other = (double)pVVar19;
      local_1878 = &local_1938;
      pCStack_1870 = &local_1938;
      local_1868.m_other = (double)local_1880.m_matrix;
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const>,0>,Eigen::Matrix<double,3,1,0,3,1>,1>,Eigen::internal::assign_op<double,double>>
                ((Matrix<double,_3,_1,_0,_3,_1> *)local_1158._16_8_,
                 (Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>
                  *)local_18a8,(assign_op<double,_double> *)&local_18f0);
      local_1128.m_other = dt;
      local_1118.m_other = dt;
      if (((SrcEvaluatorType *)local_bb8._8_8_ == (SrcEvaluatorType *)0x3) &&
         ((assign_op<double,_double> *)local_bb8._16_8_ == (assign_op<double,_double> *)0x1)) {
        local_18f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[0] = (double)local_bb8._0_8_;
        local_18a8._0_8_ = &local_18f0;
        local_18a8._16_8_ = local_19b0;
        local_18a8._8_8_ = (SrcEvaluatorType *)local_1158;
        RStack_1890.m_matrix = (non_const_type)local_bb8;
        Eigen::internal::
        dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
        ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
               *)local_18a8);
        pVVar19 = local_1b98;
        local_18a8._8_8_ = local_1ae8;
        RStack_1890.m_matrix = &local_1980;
        local_1888.m_other = (double)&local_1938;
        local_1868.m_other = (double)local_1b98;
        local_1158._0_8_ = local_258;
        local_1158._8_8_ = (SrcEvaluatorType *)0x3;
        local_1158._16_8_ = (assign_op<double,_double> *)0x1;
        local_1158._24_8_ = local_738;
        local_1138.m_other = 2.96439387504748e-323;
        local_1130.m_value = 10;
        local_1128.m_other = 7.4109846876187e-323;
        local_1880.m_matrix = (non_const_type)local_1888.m_other;
        local_1878 = (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                      *)RStack_1890.m_matrix;
        local_1858.m_other = dt;
        Eigen::internal::
        call_dense_assignment_loop<Eigen::Block<Eigen::Matrix<double,15,15,0,15,15>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>,Eigen::internal::assign_op<double,double>>
                  ((Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false> *)local_1158,
                   (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    *)local_18a8,(assign_op<double,_double> *)local_bb8);
        local_18a8._0_8_ = (assign_op<double,_double> *)0x0;
        local_18a8._8_8_ = (SrcEvaluatorType *)0x0;
        local_18a8._16_8_ = -1.0;
        SkewSymmetric((Matrix3d *)&local_18f0,(Vector3d *)local_18a8);
        local_bb8._8_8_ = 3;
        local_bb8._0_8_ = local_258 + 0x60;
        local_bb8._16_8_ = (assign_op<double,_double> *)0x1;
        local_bb8._24_8_ = local_738;
        uStack_b90 = 0xb;
        local_bb8._32_8_ = 3;
        local_b88 = 7.4109846876187e-323;
        local_1158._16_8_ = local_1158 + 0x18;
        local_18a8._16_8_ = (DstEvaluatorType *)0xbfe0000000000000;
        RStack_1890.m_matrix = (non_const_type)local_1ae8;
        local_1880.m_matrix = &local_1980;
        local_1858.m_other = (double)pVVar19;
        local_1878 = (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                      *)&local_18f0;
        pCStack_1870 = (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                        *)&local_18f0;
        local_1868.m_other = (double)local_1880.m_matrix;
        Eigen::internal::
        call_dense_assignment_loop<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const>,0>,Eigen::Matrix<double,3,1,0,3,1>,1>,Eigen::internal::assign_op<double,double>>
                  ((Matrix<double,_3,_1,_0,_3,_1> *)local_1158._16_8_,
                   (Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>
                    *)local_18a8,(assign_op<double,_double> *)local_19b0);
        local_1128.m_other = dt;
        local_1118.m_other = dt;
        if (((SrcEvaluatorType *)local_bb8._8_8_ == (SrcEvaluatorType *)0x3) &&
           ((assign_op<double,_double> *)local_bb8._16_8_ == (assign_op<double,_double> *)0x1)) {
          local_19b0._0_8_ = local_bb8._0_8_;
          local_18a8._0_8_ = (assign_op<double,_double> *)local_19b0;
          local_18a8._8_8_ = (SrcEvaluatorType *)local_1158;
          local_18a8._16_8_ = (LhsNested)local_19d0;
          RStack_1890.m_matrix = (non_const_type)local_bb8;
          Eigen::internal::
          dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
          ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                 *)local_18a8);
          local_18a8._8_8_ = local_1ae8;
          RStack_1890.m_matrix = &local_1980;
          local_1888.m_other = (double)&local_18f0;
          local_1868.m_other = (double)local_1b98;
          local_1158._0_8_ = local_258 + 0x78;
          local_1158._8_8_ = (SrcEvaluatorType *)0x3;
          local_1158._16_8_ = (assign_op<double,_double> *)0x1;
          local_1158._24_8_ = local_738;
          local_1138.m_other = 2.96439387504748e-323;
          local_1130.m_value = 0xb;
          local_1128.m_other = 7.4109846876187e-323;
          local_1880.m_matrix = (non_const_type)local_1888.m_other;
          local_1878 = (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                        *)RStack_1890.m_matrix;
          local_1858.m_other = dt;
          Eigen::internal::
          call_dense_assignment_loop<Eigen::Block<Eigen::Matrix<double,15,15,0,15,15>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>,Eigen::internal::assign_op<double,double>>
                    ((Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false> *)local_1158,
                     (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      *)local_18a8,(assign_op<double,_double> *)local_bb8);
          puVar9 = local_2b0;
          lVar6 = 0;
          lVar14 = 0;
          do {
            lVar18 = 0;
            auVar31 = _DAT_001104c0;
            do {
              bVar37 = SUB164(auVar31 ^ _DAT_001104d0,4) == local_1bc8._0_4_ &&
                       SUB164(auVar31 ^ _DAT_001104d0,0) < -0x7ffffffd;
              if (bVar37) {
                uVar46 = 0x3ff0000000000000;
                if (lVar6 != lVar18) {
                  uVar46 = 0;
                }
                *(undefined8 *)(puVar9 + lVar18 + -8) = uVar46;
              }
              if (bVar37) {
                uVar46 = 0x3ff0000000000000;
                if (lVar6 + -8 != lVar18) {
                  uVar46 = 0;
                }
                *(undefined8 *)(puVar9 + lVar18) = uVar46;
              }
              lVar36 = auVar31._8_8_;
              auVar31._0_8_ = auVar31._0_8_ + 2;
              auVar31._8_8_ = lVar36 + 2;
              lVar18 = lVar18 + 0x10;
            } while (lVar18 != 0x20);
            lVar14 = lVar14 + 1;
            lVar6 = lVar6 + 8;
            puVar9 = puVar9 + 0x78;
          } while (lVar14 != 3);
          local_1888.m_other = -0.5;
          local_1880.m_matrix = (non_const_type)local_1ae8;
          local_1158._0_8_ = local_258 + 0xd8;
          local_1158._8_8_ = (SrcEvaluatorType *)0x3;
          local_1158._16_8_ = (plainobjectbase_evaluator_data<double,_0>)0x3;
          local_1158._24_8_ = local_738;
          local_1138.m_other = 1.48219693752374e-323;
          local_1130.m_value = 0xc;
          local_1128.m_other = 7.4109846876187e-323;
          local_1868.m_other = dt;
          local_1850.m_other = dt;
          Eigen::internal::
          check_for_aliasing<Eigen::Block<Eigen::Matrix<double,15,15,0,15,15>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>>
                    ((Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false> *)local_1158,
                     (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                      *)local_18a8);
          if (((SrcEvaluatorType *)local_1158._8_8_ == (SrcEvaluatorType *)0x3) &&
             ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
               *)local_1158._16_8_ ==
              (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
               *)0x3)) {
            lVar6 = 0;
            pdVar11 = (double *)local_1158._0_8_;
            do {
              lVar14 = 0;
              pdVar17 = (double *)local_1880.m_matrix;
              do {
                (((DstEvaluatorType *)(pdVar11 + lVar14))->
                super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>).m_d
                .data = (double *)
                        (*pdVar17 * local_1888.m_other * local_1868.m_other * local_1850.m_other);
                lVar14 = lVar14 + 1;
                pdVar17 = pdVar17 + 3;
              } while (lVar14 != 3);
              lVar6 = lVar6 + 1;
              local_1880.m_matrix = (non_const_type)((long)local_1880.m_matrix + 8);
              pdVar11 = pdVar11 + 0xf;
            } while (lVar6 != 3);
            local_1158._8_8_ = local_1ae8;
            local_18a8._0_8_ = local_258 + 0xf0;
            local_18a8._8_8_ = (SrcEvaluatorType *)0x3;
            local_18a8._16_8_ = (DstEvaluatorType *)0x3;
            RStack_1890.m_matrix = (non_const_type)local_738;
            local_1888.m_other = 2.96439387504748e-323;
            local_1880.m_matrix = (non_const_type)0xc;
            local_1878 = (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                          *)0xf;
            local_1138.m_other = dt;
            Eigen::internal::
            check_for_aliasing<Eigen::Block<Eigen::Matrix<double,15,15,0,15,15>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>>
                      ((Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false> *)local_18a8,
                       (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                        *)local_1158);
            auVar23 = _DAT_001104d0;
            if (((SrcEvaluatorType *)local_18a8._8_8_ == (SrcEvaluatorType *)0x3) &&
               ((DstEvaluatorType *)local_18a8._16_8_ == (DstEvaluatorType *)0x3)) {
              lVar6 = 0;
              peVar10 = (evaluator<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                         *)local_1158._8_8_;
              paVar12 = (assign_op<double,_double> *)local_18a8._0_8_;
              do {
                lVar14 = 0;
                peVar16 = peVar10;
                do {
                  *(double *)(paVar12 + lVar14 * 8) =
                       -*(double *)
                         &((binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                            *)&peVar16->
                               super_evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                          )->m_d * local_1138.m_other;
                  lVar14 = lVar14 + 1;
                  peVar16 = &(((evaluator<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                                *)(peVar16 + 1))->
                             super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                             ).
                             super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                             .m_d.lhsImpl;
                } while (lVar14 != 3);
                lVar6 = lVar6 + 1;
                peVar10 = (evaluator<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                           *)&(peVar10->
                              super_evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                              ).field_0x8;
                paVar12 = paVar12 + 0x78;
              } while (lVar6 != 3);
              puVar9 = local_130;
              lVar6 = 0;
              lVar14 = 0;
              do {
                lVar18 = 0;
                auVar32 = _DAT_001104c0;
                do {
                  bVar37 = SUB164(auVar32 ^ auVar23,4) == local_1bc8._0_4_ &&
                           SUB164(auVar32 ^ auVar23,0) < -0x7ffffffd;
                  if (bVar37) {
                    uVar46 = 0x3ff0000000000000;
                    if (lVar6 != lVar18) {
                      uVar46 = 0;
                    }
                    *(undefined8 *)(puVar9 + lVar18 + -8) = uVar46;
                  }
                  if (bVar37) {
                    uVar46 = 0x3ff0000000000000;
                    if (lVar6 + -8 != lVar18) {
                      uVar46 = 0;
                    }
                    *(undefined8 *)(puVar9 + lVar18) = uVar46;
                  }
                  lVar36 = auVar32._8_8_;
                  auVar32._0_8_ = auVar32._0_8_ + 2;
                  auVar32._8_8_ = lVar36 + 2;
                  lVar18 = lVar18 + 0x10;
                } while (lVar18 != 0x20);
                lVar14 = lVar14 + 1;
                lVar6 = lVar6 + 8;
                puVar9 = puVar9 + 0x78;
              } while (lVar14 != 3);
              memset((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                      *)local_1158,0,0x5a0);
              local_bb8._0_8_ =
                   (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                    *)local_1158;
              local_bb8._8_8_ = (SrcEvaluatorType *)0x3;
              local_bb8._16_8_ = (assign_op<double,_double> *)0x3;
              local_bb8._24_8_ =
                   (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                    *)local_1158;
              stack0xfffffffffffff468 = (undefined1  [16])0x0;
              local_b88 = 7.4109846876187e-323;
              local_18a8._8_8_ = (SrcEvaluatorType *)(local_18a8 + 0x10);
              lVar6 = 0x20;
              do {
                dVar21 = *(double *)((long)local_1a38 + lVar6 + 0x10);
                dVar20 = *(double *)((long)local_1a38 + lVar6);
                dVar24 = *(double *)((long)local_1a38 + lVar6 + 8);
                *(double *)
                 ((long)local_18f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array + lVar6 + 0x38) =
                     dVar24 * -(double)local_1b38._24_8_ + dVar20 * -(double)local_1b38._0_8_ +
                     dVar21 * -(double)local_1b38._48_8_;
                *(double *)
                 ((long)local_18f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array + lVar6 + 0x40) =
                     dVar24 * -(double)local_1b38._32_8_ + dVar20 * -(double)local_1b38._8_8_ +
                     dVar21 * -(double)local_1b38._56_8_;
                *(double *)(local_18a8 + lVar6) =
                     (dVar21 * -(double)local_1b38._64_8_ - dVar24 * (double)local_1b38._40_8_) -
                     dVar20 * (double)local_1b38._16_8_;
                lVar6 = lVar6 + 0x18;
              } while (lVar6 != 0x68);
              local_19b0._16_8_ = &local_1b60;
              local_19d0._0_8_ =
                   (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                    *)local_1158;
              local_19b0._0_8_ = (LhsNested)local_19d0;
              local_19b0._8_8_ = (RhsNested)local_18a8;
              local_19b0._24_8_ = (assign_op<double,_double> *)local_bb8;
              local_1850.m_other = dt;
              Eigen::internal::
              dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_15,_12,_0,_15,_12>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
              ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_15,_12,_0,_15,_12>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                     *)local_19b0);
              local_1888.m_other = -0.5;
              local_1880.m_matrix = (non_const_type)local_1ae8;
              local_bb8._8_8_ = 3;
              local_bb8._0_8_ = local_fd8;
              local_bb8._16_8_ = (assign_op<double,_double> *)0x3;
              uStack_b90 = 3;
              local_bb8._32_8_ = 3;
              local_b88 = 7.4109846876187e-323;
              local_1868.m_other = dt;
              local_1850.m_other = dt;
              local_bb8._24_8_ =
                   (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                    *)local_1158;
              Eigen::internal::
              check_for_aliasing<Eigen::Block<Eigen::Matrix<double,15,12,0,15,12>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>>
                        ((Block<Eigen::Matrix<double,_15,_12,_0,_15,_12>,__1,__1,_false> *)local_bb8
                         ,(CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                           *)local_18a8);
              if (((SrcEvaluatorType *)local_bb8._8_8_ == (SrcEvaluatorType *)0x3) &&
                 ((assign_op<double,_double> *)local_bb8._16_8_ == (assign_op<double,_double> *)0x3)
                 ) {
                lVar6 = 0;
                pDVar13 = (DstEvaluatorType *)local_bb8._0_8_;
                do {
                  lVar14 = 0;
                  pdVar11 = (double *)local_1880.m_matrix;
                  do {
                    (&(pDVar13->
                      super_block_evaluator<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false,_true>
                      ).
                      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,_15,_15>_>
                      .m_data)[lVar14] =
                         (PointerType)
                         (*pdVar11 * local_1888.m_other * local_1868.m_other * local_1850.m_other);
                    lVar14 = lVar14 + 1;
                    pdVar11 = pdVar11 + 3;
                  } while (lVar14 != 3);
                  lVar6 = lVar6 + 1;
                  local_1880.m_matrix = (non_const_type)((long)local_1880.m_matrix + 8);
                  pDVar13 = (DstEvaluatorType *)
                            &pDVar13[7].
                             super_block_evaluator<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false,_true>
                             .
                             super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,_15,_15>_>
                             .field_0x8;
                } while (lVar6 != 3);
                local_bb8._8_8_ = local_1ae8;
                local_bb8._32_8_ = dt;
                local_18a8._0_8_ = local_fc0;
                local_18a8._8_8_ = (SrcEvaluatorType *)0x3;
                local_18a8._16_8_ = (DstEvaluatorType *)0x3;
                local_1888.m_other = 2.96439387504748e-323;
                local_1880.m_matrix = (non_const_type)0x3;
                local_1878 = (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                              *)0xf;
                RStack_1890.m_matrix = (non_const_type)local_1158;
                Eigen::internal::
                check_for_aliasing<Eigen::Block<Eigen::Matrix<double,15,12,0,15,12>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>>
                          ((Block<Eigen::Matrix<double,_15,_12,_0,_15,_12>,__1,__1,_false> *)
                           local_18a8,
                           (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                            *)local_bb8);
                auVar23 = _DAT_001104d0;
                if (((SrcEvaluatorType *)local_18a8._8_8_ == (SrcEvaluatorType *)0x3) &&
                   ((DstEvaluatorType *)local_18a8._16_8_ == (DstEvaluatorType *)0x3)) {
                  lVar6 = 0;
                  pdVar11 = (double *)local_bb8._8_8_;
                  paVar12 = (assign_op<double,_double> *)local_18a8._0_8_;
                  do {
                    lVar14 = 0;
                    pdVar17 = pdVar11;
                    do {
                      *(double *)(paVar12 + lVar14 * 8) = -*pdVar17 * (double)local_bb8._32_8_;
                      lVar14 = lVar14 + 1;
                      pdVar17 = pdVar17 + 3;
                    } while (lVar14 != 3);
                    lVar6 = lVar6 + 1;
                    pdVar11 = pdVar11 + 1;
                    paVar12 = paVar12 + 0x78;
                  } while (lVar6 != 3);
                  puVar9 = local_e38;
                  lVar6 = 0;
                  lVar14 = 0;
                  do {
                    lVar18 = 0;
                    auVar33 = _DAT_001104c0;
                    do {
                      auVar39 = auVar33 ^ auVar23;
                      bVar37 = auVar39._4_4_ == local_1bc8._0_4_ && auVar39._0_4_ < -0x7ffffffd;
                      if (bVar37) {
                        uVar46 = 0x3ff0000000000000;
                        if (lVar6 != lVar18) {
                          uVar46 = 0;
                        }
                        *(undefined8 *)(puVar9 + lVar18 + -8) = uVar46;
                      }
                      if (bVar37) {
                        uVar46 = 0x3ff0000000000000;
                        if (lVar6 + -8 != lVar18) {
                          uVar46 = 0;
                        }
                        *(undefined8 *)(puVar9 + lVar18) = uVar46;
                      }
                      lVar36 = auVar33._8_8_;
                      auVar33._0_8_ = auVar33._0_8_ + 2;
                      auVar33._8_8_ = lVar36 + 2;
                      lVar18 = lVar18 + 0x10;
                    } while (lVar18 != 0x20);
                    lVar14 = lVar14 + 1;
                    lVar6 = lVar6 + 8;
                    puVar9 = puVar9 + 0x78;
                  } while (lVar14 != 3);
                  puVar9 = local_cb8;
                  lVar6 = 0;
                  lVar14 = 0;
                  do {
                    lVar18 = 0;
                    auVar34 = _DAT_001104c0;
                    do {
                      auVar39 = auVar34 ^ auVar23;
                      bVar37 = auVar39._4_4_ == local_1bc8._0_4_ && auVar39._0_4_ < -0x7ffffffd;
                      if (bVar37) {
                        uVar46 = 0x3ff0000000000000;
                        if (lVar6 != lVar18) {
                          uVar46 = 0;
                        }
                        *(undefined8 *)(puVar9 + lVar18 + -8) = uVar46;
                      }
                      if (bVar37) {
                        uVar46 = 0x3ff0000000000000;
                        if (lVar6 + -8 != lVar18) {
                          uVar46 = 0;
                        }
                        *(undefined8 *)(puVar9 + lVar18) = uVar46;
                      }
                      lVar36 = auVar34._8_8_;
                      auVar34._0_8_ = auVar34._0_8_ + 2;
                      auVar34._8_8_ = lVar36 + 2;
                      lVar18 = lVar18 + 0x10;
                    } while (lVar18 != 0x20);
                    lVar14 = lVar14 + 1;
                    lVar6 = lVar6 + 8;
                    puVar9 = puVar9 + 0x78;
                  } while (lVar14 != 3);
                  lVar14 = 0;
                  memset((RhsNested)local_bb8,0,0x480);
                  dVar21 = this->gyro_noise * this->gyro_noise;
                  puVar9 = local_bb8 + 8;
                  lVar6 = 0;
                  do {
                    lVar18 = 0;
                    auVar40 = _DAT_001104c0;
                    do {
                      bVar37 = SUB164(auVar40 ^ _DAT_001104d0,4) == local_1bc8._0_4_ &&
                               SUB164(auVar40 ^ _DAT_001104d0,0) < -0x7ffffffd;
                      if (bVar37) {
                        dVar20 = 1.0;
                        if (lVar14 != lVar18) {
                          dVar20 = 0.0;
                        }
                        *(double *)(puVar9 + lVar18 + -8) = (dVar20 * dVar21) / dt;
                      }
                      if (bVar37) {
                        dVar20 = 1.0;
                        if (lVar14 + -8 != lVar18) {
                          dVar20 = 0.0;
                        }
                        *(double *)(puVar9 + lVar18) = (dVar20 * dVar21) / dt;
                      }
                      lVar36 = auVar40._8_8_;
                      auVar40._0_8_ = auVar40._0_8_ + 2;
                      auVar40._8_8_ = lVar36 + 2;
                      lVar18 = lVar18 + 0x10;
                    } while (lVar18 != 0x20);
                    lVar6 = lVar6 + 1;
                    lVar14 = lVar14 + 8;
                    puVar9 = puVar9 + 0x60;
                  } while (lVar6 != 3);
                  dVar21 = this->accel_noise * this->accel_noise;
                  puVar9 = local_a78;
                  lVar6 = 0;
                  lVar14 = 0;
                  do {
                    lVar18 = 0;
                    auVar41 = _DAT_001104c0;
                    do {
                      bVar37 = SUB164(auVar41 ^ _DAT_001104d0,4) == local_1bc8._0_4_ &&
                               SUB164(auVar41 ^ _DAT_001104d0,0) < -0x7ffffffd;
                      if (bVar37) {
                        dVar20 = 1.0;
                        if (lVar6 != lVar18) {
                          dVar20 = 0.0;
                        }
                        *(double *)(puVar9 + lVar18 + -8) = (dVar20 * dVar21) / dt;
                      }
                      if (bVar37) {
                        dVar20 = 1.0;
                        if (lVar6 + -8 != lVar18) {
                          dVar20 = 0.0;
                        }
                        *(double *)(puVar9 + lVar18) = (dVar20 * dVar21) / dt;
                      }
                      lVar36 = auVar41._8_8_;
                      auVar41._0_8_ = auVar41._0_8_ + 2;
                      auVar41._8_8_ = lVar36 + 2;
                      lVar18 = lVar18 + 0x10;
                    } while (lVar18 != 0x20);
                    lVar14 = lVar14 + 1;
                    lVar6 = lVar6 + 8;
                    puVar9 = puVar9 + 0x60;
                  } while (lVar14 != 3);
                  dVar21 = this->gyro_rw * this->gyro_rw;
                  puVar9 = local_940;
                  lVar6 = 0;
                  lVar14 = 0;
                  do {
                    lVar18 = 0;
                    auVar42 = _DAT_001104c0;
                    do {
                      bVar37 = SUB164(auVar42 ^ _DAT_001104d0,4) == local_1bc8._0_4_ &&
                               SUB164(auVar42 ^ _DAT_001104d0,0) < -0x7ffffffd;
                      if (bVar37) {
                        dVar20 = 1.0;
                        if (lVar6 != lVar18) {
                          dVar20 = 0.0;
                        }
                        *(double *)(puVar9 + lVar18 + -8) = dVar20 * dVar21 * dt;
                      }
                      if (bVar37) {
                        dVar20 = 1.0;
                        if (lVar6 + -8 != lVar18) {
                          dVar20 = 0.0;
                        }
                        *(double *)(puVar9 + lVar18) = dVar20 * dVar21 * dt;
                      }
                      lVar36 = auVar42._8_8_;
                      auVar42._0_8_ = auVar42._0_8_ + 2;
                      auVar42._8_8_ = lVar36 + 2;
                      lVar18 = lVar18 + 0x10;
                    } while (lVar18 != 0x20);
                    lVar14 = lVar14 + 1;
                    lVar6 = lVar6 + 8;
                    puVar9 = puVar9 + 0x60;
                  } while (lVar14 != 3);
                  dVar21 = this->accel_rw * this->accel_rw;
                  puVar9 = local_808;
                  lVar6 = 0;
                  lVar14 = 0;
                  do {
                    lVar18 = 0;
                    auVar43 = _DAT_001104c0;
                    do {
                      bVar37 = SUB164(auVar43 ^ _DAT_001104d0,4) == local_1bc8._0_4_ &&
                               SUB164(auVar43 ^ _DAT_001104d0,0) < -0x7ffffffd;
                      if (bVar37) {
                        dVar20 = 1.0;
                        if (lVar6 != lVar18) {
                          dVar20 = 0.0;
                        }
                        *(double *)(puVar9 + lVar18 + -8) = dVar20 * dVar21 * dt;
                      }
                      if (bVar37) {
                        dVar20 = 1.0;
                        if (lVar6 + -8 != lVar18) {
                          dVar20 = 0.0;
                        }
                        *(double *)(puVar9 + lVar18) = dVar20 * dVar21 * dt;
                      }
                      lVar36 = auVar43._8_8_;
                      auVar43._0_8_ = auVar43._0_8_ + 2;
                      auVar43._8_8_ = lVar36 + 2;
                      lVar18 = lVar18 + 0x10;
                    } while (lVar18 != 0x20);
                    lVar14 = lVar14 + 1;
                    lVar6 = lVar6 + 8;
                    puVar9 = puVar9 + 0x60;
                  } while (lVar14 != 3);
                  lVar6 = 0;
                  local_19b0._0_8_ =
                       (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                        *)local_1158;
                  local_19b0._8_8_ = (RhsNested)local_bb8;
                  local_19b0._16_8_ =
                       (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                        *)local_1158;
                  memset((Matrix<double,_15,_15,_0,_15,_15> *)local_18a8,0,0x708);
                  local_19d0._0_8_ = (DstEvaluatorType *)0x3ff0000000000000;
                  Eigen::internal::
                  generic_product_impl<Eigen::Product<Eigen::Matrix<double,15,12,0,15,12>,Eigen::Matrix<double,12,12,0,12,12>,0>,Eigen::Transpose<Eigen::Matrix<double,15,12,0,15,12>>,Eigen::DenseShape,Eigen::DenseShape,8>
                  ::scaleAndAddTo<Eigen::Matrix<double,15,15,0,15,15>>
                            ((Matrix<double,_15,_15,_0,_15,_15> *)local_18a8,
                             (Product<Eigen::Matrix<double,_15,_12,_0,_15,_12>,_Eigen::Matrix<double,_12,_12,_0,_12,_12>,_0>
                              *)local_19b0,
                             (Transpose<Eigen::Matrix<double,_15,_12,_0,_15,_12>_> *)
                             (local_19b0 + 0x10),(Scalar *)local_19d0);
                  local_19b0._8_8_ = (RhsNested)0x3fe0000000000000;
                  local_19d0._0_8_ = &local_1b60;
                  local_19d0._16_8_ = &local_1bc9;
                  local_1b60.data = (double *)local_18a8;
                  local_19d0._8_8_ =
                       (Product<Eigen::Matrix<double,_15,_12,_0,_15,_12>,_Eigen::Matrix<double,_12,_12,_0,_12,_12>,_0>
                        *)local_19b0;
                  local_19d0._24_8_ = (Matrix<double,_15,_15,_0,_15,_15> *)local_18a8;
                  local_19b0._32_8_ = (Matrix<double,_15,_15,_0,_15,_15> *)local_18a8;
                  local_1988 = (Matrix<double,_15,_15,_0,_15,_15> *)local_18a8;
                  Eigen::internal::
                  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_15,_15,_0,_15,_15>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_15,_15,_0,_15,_15>,_const_Eigen::Transpose<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_1>
                  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_15,_15,_0,_15,_15>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_15,_15,_0,_15,_15>,_const_Eigen::Transpose<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                         *)local_19d0);
                  dst = &this->P_;
                  local_19b0._0_8_ = local_738;
                  local_19b0._8_8_ = dst;
                  local_19b0._16_8_ = local_19b0._0_8_;
                  local_19b0._24_8_ = (Matrix<double,_15,_15,_0,_15,_15> *)local_18a8;
                  Eigen::internal::
                  call_dense_assignment_loop<Eigen::Matrix<double,15,15,0,15,15>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,15,15,0,15,15>,Eigen::Matrix<double,15,15,0,15,15>,0>,Eigen::Transpose<Eigen::Matrix<double,15,15,0,15,15>>,0>const,Eigen::Matrix<double,15,15,0,15,15>const>,Eigen::internal::assign_op<double,double>>
                            (dst,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_15,_15,_0,_15,_15>,_Eigen::Matrix<double,_15,_15,_0,_15,_15>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>,_0>,_const_Eigen::Matrix<double,_15,_15,_0,_15,_15>_>
                                  *)local_19b0,(assign_op<double,_double> *)local_19d0);
                  do {
                    if ((dst->super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>).
                        m_storage.m_data.array[0] <= 0.0 &&
                        (dst->super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>).
                        m_storage.m_data.array[0] != 0.0) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"WARNING: P is not PSD!\n",0x17);
                    }
                    lVar6 = lVar6 + 1;
                    dst = (Matrix<double,_15,_15,_0,_15,_15> *)
                          ((dst->super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>).
                           m_storage.m_data.array + 0x10);
                  } while (lVar6 != 0xf);
                  return;
                }
              }
              __function = 
              "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, 15, 12>>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, 15, 12>>]"
              ;
              goto LAB_00105ee5;
            }
          }
        }
      }
    }
    __function = 
    "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, 15, 15>>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, 15, 15>>]"
    ;
  }
  else {
    __function = 
    "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, 4, 4>>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, 4, 4>>]"
    ;
  }
LAB_00105ee5:
  __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,__function);
}

Assistant:

void InsEkf::Predict(double dt) { // https://docs.openvins.com/propagation.html

        Eigen::Vector3d w_est = last_measurements_.segment(m_I(MI::p), 3) - bias_g_;
        Eigen::Vector3d a_est = last_measurements_.segment(m_I(MI::ax), 3) - bias_a_;

        // subtract the effect of rotating at offset from vehicle center
        a_est -= SkewSymmetric(w_est) * SkewSymmetric(w_est) * imu_offset_;

        Eigen::Matrix3d w_ss = SkewSymmetric(w_est);
        Eigen::Matrix4d omega = Eigen::Matrix4d::Zero();
        omega.block(0, 0, 3, 3) = -w_ss;
        omega.block(0, 3, 3, 1) = w_est;
        omega.block(3, 0, 1, 3) = -w_est.transpose();

        double angle_rate = w_est.norm();

        // Trawny et al, equation 103, p.12
        Eigen::Matrix4d theta = Eigen::Matrix4d::Identity() + 0.5 * dt * omega;
        if(angle_rate > 1e-10)
            theta = cos(0.5 * angle_rate * dt) * Eigen::Matrix4d::Identity() + (1.0 / angle_rate) * sin(0.5 * angle_rate * dt) * omega;

        // propagate orientation
        orientation_ = theta * orientation_;

        // propagate velocity and position
        Eigen::Matrix3d R_ItoB_hat = RPYToRotMat(QuatToRPY(orientation_)); // rotation matrix estimate from inertial to body frame
        velocity_ = velocity_ - dt * gravity_ + R_ItoB_hat.transpose() * a_est * dt;
        position_ = position_ + dt * velocity_ - 0.5 * gravity_ * dt * dt + 0.5 * R_ItoB_hat.transpose() * a_est * dt * dt;

        // propagate covariance
        double angle = angle_rate * dt;

        // exponential map
        Eigen::Matrix3d R_pert = Eigen::Matrix3d::Identity();
        // SO3 right jacobian
        Eigen::Matrix3d Jr = Eigen::Matrix3d::Identity();

        if(angle > 1e-10){
            Eigen::Vector3d rate_vect = w_est / angle_rate; // normalize

            // Barfoot, equation 6.56, p. 189
            R_pert = cos(angle) * Eigen::Matrix3d::Identity() + (1.0 - cos(angle)) * (rate_vect * rate_vect.transpose()) +
                                     sin(angle) * SkewSymmetric(rate_vect);

            // Barfoot, equation 7.77a, p. 233
            Jr = (sin(angle) / angle) * Eigen::Matrix3d::Identity() + (1.0 - sin(angle) / angle) * (rate_vect * rate_vect.transpose()) -
                 ((1.0 - cos(angle))/angle) * SkewSymmetric(rate_vect);
        }

        Eigen::Matrix<double, s_I(SI::NUM_STATES), s_I(SI::NUM_STATES)> Phi_k = Eigen::Matrix<double, s_I(SI::NUM_STATES), s_I(SI::NUM_STATES)>::Zero();
        Phi_k.block(s_I(SI::roll), s_I(SI::roll), 3, 3) = R_pert;
        Phi_k.block(s_I(SI::x), s_I(SI::roll), 3, 3) = -0.5 * R_ItoB_hat.transpose() * SkewSymmetric(a_est * dt * dt);
        Phi_k.block(s_I(SI::Vx), s_I(SI::roll), 3, 3) = -R_ItoB_hat.transpose() * SkewSymmetric(a_est * dt);

        Phi_k.block(s_I(SI::x), s_I(SI::x), 3, 3).setIdentity();

        Phi_k.block(s_I(SI::x), s_I(SI::Vx), 3, 3) = dt * Eigen::Matrix3d::Identity();
        Phi_k.block(s_I(SI::Vx), s_I(SI::Vx), 3, 3).setIdentity();

        Phi_k.block(s_I(SI::roll), s_I(SI::biasGp), 3, 3) = -R_pert * Jr * dt;
        Eigen::Matrix3d d_w_skew_d_biasGp = SkewSymmetric(Eigen::Vector3d{-1.0, 0.0, 0.0});
        Phi_k.block(s_I(SI::x), s_I(SI::biasGp), 3, 1) = -0.5 * R_ItoB_hat.transpose() * (w_ss*d_w_skew_d_biasGp + d_w_skew_d_biasGp*w_ss) * imu_offset_ * dt * dt;
        Phi_k.block(s_I(SI::Vx), s_I(SI::biasGp), 3, 1) = -R_ItoB_hat.transpose() * (w_ss*d_w_skew_d_biasGp + d_w_skew_d_biasGp*w_ss) * imu_offset_ * dt;
        Eigen::Matrix3d d_w_skew_d_biasGq = SkewSymmetric(Eigen::Vector3d{0.0, -1.0, 0.0});
        Phi_k.block(s_I(SI::x), s_I(SI::biasGq), 3, 1) = -0.5 * R_ItoB_hat.transpose() * (w_ss*d_w_skew_d_biasGq + d_w_skew_d_biasGq*w_ss) * imu_offset_ * dt * dt;
        Phi_k.block(s_I(SI::Vx), s_I(SI::biasGq), 3, 1) = -R_ItoB_hat.transpose() * (w_ss*d_w_skew_d_biasGq + d_w_skew_d_biasGq*w_ss) * imu_offset_ * dt;
        Eigen::Matrix3d d_w_skew_d_biasGr = SkewSymmetric(Eigen::Vector3d{0.0, 0.0, -1.0});
        Phi_k.block(s_I(SI::x), s_I(SI::biasGr), 3, 1) = -0.5 * R_ItoB_hat.transpose() * (w_ss*d_w_skew_d_biasGr + d_w_skew_d_biasGr*w_ss) * imu_offset_ * dt * dt;
        Phi_k.block(s_I(SI::Vx), s_I(SI::biasGr), 3, 1) = -R_ItoB_hat.transpose() * (w_ss*d_w_skew_d_biasGr + d_w_skew_d_biasGr*w_ss) * imu_offset_ * dt;
        Phi_k.block(s_I(SI::biasGp), s_I(SI::biasGp), 3, 3).setIdentity();

        Phi_k.block(s_I(SI::x), s_I(SI::biasAx), 3, 3) = -0.5 * R_ItoB_hat.transpose() * dt * dt;
        Phi_k.block(s_I(SI::Vx), s_I(SI::biasAx), 3, 3) = -R_ItoB_hat.transpose() * dt;
        Phi_k.block(s_I(SI::biasAx), s_I(SI::biasAx), 3, 3).setIdentity();


        Eigen::Matrix<double, s_I(SI::NUM_STATES), 12> Gk = Eigen::Matrix<double, s_I(SI::NUM_STATES), 12>::Zero();
        Gk.block(s_I(SI::roll), m_I(MI::p), 3, 3) = -R_pert * Jr * dt;
        Gk.block(s_I(SI::x), m_I(MI::ax), 3, 3) = -0.5 * R_ItoB_hat.transpose() * dt * dt;
        Gk.block(s_I(SI::Vx), m_I(MI::ax), 3 ,3) = -R_ItoB_hat.transpose() * dt;
        Gk.block(s_I(SI::biasGp), m_I(MI::p) + 6, 3, 3).setIdentity();
        Gk.block(s_I(SI::biasAx), m_I(MI::ax) + 6, 3, 3).setIdentity();

        Eigen::Matrix<double, 12, 12> Qd = Eigen::Matrix<double, 12, 12>::Zero();
        Qd.block(m_I(MI::p), m_I(MI::p), 3, 3) = pow(gyro_noise, 2) * Eigen::Matrix3d::Identity() / dt;
        Qd.block(m_I(MI::ax), m_I(MI::ax), 3, 3) = pow(accel_noise, 2) * Eigen::Matrix3d::Identity() / dt;
        Qd.block(m_I(MI::p) + 6, m_I(MI::p) + 6, 3, 3) = pow(gyro_rw, 2) * Eigen::Matrix3d::Identity() * dt;
        Qd.block(m_I(MI::ax) + 6, m_I(MI::ax) + 6, 3, 3) = pow(accel_rw, 2) * Eigen::Matrix3d::Identity() * dt;

        Eigen::Matrix<double, 15, 15> GQG = Gk * Qd * Gk.transpose();
        GQG = 0.5 * (GQG + GQG.transpose());

        P_ = Phi_k * P_ * Phi_k.transpose() + GQG;

        for(auto i = 0; i < P_.cols(); ++i){
            if(P_(i, i) < 0.0)
                std::cout<<"WARNING: P is not PSD!\n";
        }
    }